

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAMCoupe.cpp
# Opt level: O3

bool IsBDOSDisk(HDD *hdd,BDOS_CAPS *bdc)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int i;
  long lVar5;
  int sector;
  int iVar6;
  int iVar7;
  MEMORY mem;
  int local_4c;
  MEMORY local_48;
  
  if (hdd->sector_size != 0x200) {
    return false;
  }
  local_48._vptr_MEMORY = (_func_int **)&PTR__MEMORY_001db450;
  local_48.size = 0x200;
  local_48.pb = AllocMem(0x200);
  GetBDOSCaps((long)hdd->sectors * (long)hdd->heads * (long)hdd->cyls,bdc);
  bVar4 = ReadSector(hdd,bdc->base_sectors,&local_48);
  if (bVar4) {
    iVar6 = *(int *)((long)local_48.pb + 0xe8);
    bdc->need_byteswap = iVar6 == 0x4f534244;
    bVar4 = true;
    if ((iVar6 == 0x4f534244) || (*(int *)((long)local_48.pb + 0xe8) == 0x534f4442))
    goto LAB_00165ea8;
  }
  if (hdd->total_sectors == 0) {
    sector = 0;
    iVar6 = 0;
    iVar7 = 0;
    local_4c = 0;
  }
  else {
    iVar6 = (int)hdd->total_sectors;
    iVar7 = 0x64001c2;
    if (iVar6 < 0x64001c2) {
      iVar7 = iVar6;
    }
    iVar3 = iVar7 >> 0x1f;
    iVar2 = iVar7 / 0xc800 + iVar3;
    local_4c = (iVar2 - iVar3) + 1;
    sector = (iVar2 - iVar3) + 2;
    iVar6 = (iVar7 - sector) / 0x640;
    iVar7 = (iVar7 - (iVar2 - iVar3)) + iVar6 * -0x640 + -2;
    iVar6 = (uint)(0x31 < iVar7) + iVar6;
  }
  if (((sector == bdc->base_sectors) || (bVar4 = ReadSector(hdd,sector,&local_48), !bVar4)) ||
     ((iVar2 = *(int *)((long)local_48.pb + 0xe8), iVar2 != 0x4f534244 &&
      (*(int *)((long)local_48.pb + 0xe8) != 0x534f4442)))) {
    bVar4 = ReadSector(hdd,0,&local_48);
    if (bVar4) {
      lVar5 = 0;
      do {
        *(byte *)((long)local_48.pb + lVar5) = *(byte *)((long)local_48.pb + lVar5) & 0x5f;
        pbVar1 = (byte *)((long)local_48.pb + lVar5 + 0x100);
        *pbVar1 = *pbVar1 & 0x5f;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      iVar6 = *(int *)local_48.pb;
      bdc->need_byteswap = iVar6 == 0x4f54424f;
      if (iVar6 == 0x4f54424f) {
        bVar4 = true;
      }
      else {
        bVar4 = *(int *)((long)local_48.pb + 0x100) == 0x544f4f42;
      }
      bdc->bootable = bVar4;
    }
    else {
      bVar4 = false;
    }
  }
  else {
    bdc->list_sectors = local_4c;
    bdc->base_sectors = sector;
    bdc->records = iVar6;
    bdc->extra_sectors = iVar7;
    bdc->need_byteswap = iVar2 == 0x4f534244;
    bdc->bootable = false;
    bdc->lba = true;
    bVar4 = true;
  }
LAB_00165ea8:
  local_48._vptr_MEMORY = (_func_int **)&PTR__MEMORY_001db450;
  FreeMem(local_48.pb);
  return bVar4;
}

Assistant:

bool IsBDOSDisk(const HDD& hdd, BDOS_CAPS& bdc)
{
    bool f = false;

    // Sector size must be 512 bytes for BDOS
    if (hdd.sector_size != BDOS_SECTOR_SIZE)
        return false;

    MEMORY mem(hdd.sector_size);

    // Determine BDOS parameters from the CHS geometry (as BDOS does)
    GetBDOSCaps(hdd.cyls * hdd.heads * hdd.sectors, bdc);

    // Read the first sector in record 1 to check for a BDOS signature
    if (ReadSector(hdd, bdc.base_sectors, mem))
    {
        f = bdc.need_byteswap = !memcmp(mem + 232, "DBSO", 4);
        if (!f) f = !memcmp(mem + 232, "BDOS", 4);
    }

    // If that didn't work, try record 1 using LBA sector count
    if (!f)
    {
        // Determine the BDOS parameters from the LBA sector count (as Trinity does, and SAMdisk used to)
        BDOS_CAPS bdcLBA;
        GetBDOSCaps(hdd.total_sectors, bdcLBA);

        // Only check the base sector if it differs from the CHS position
        if (bdcLBA.base_sectors != bdc.base_sectors && ReadSector(hdd, bdcLBA.base_sectors, mem))
        {
            f = bdcLBA.need_byteswap = !memcmp(mem + 232, "DBSO", 4);
            if (!f) f = !memcmp(mem + 232, "BDOS", 4);
            bdcLBA.lba = f;

            // If the disk is relying on the LBA sector count, use the new details
            if (f)
                bdc = bdcLBA;
        }
    }

    // If we're still not sure, check for a BDOS boot sector
    if (!f && ReadSector(hdd, 0, mem))
    {
        // Clear bits 7 and 5 (case) for the boot signature check
        for (int i = 0; i < 4; ++i) { mem[i + 0x000] &= ~0xa0; mem[i + 0x100] &= ~0xa0; }

        // Check for the boot sector signatures at the appropriate offsets for Atom and Atom Lite
        bdc.need_byteswap = !memcmp(mem + 0x000, "OBTO", 4);
        bdc.bootable = bdc.need_byteswap || !memcmp(mem + 0x100, "BOOT", 4);
        f = bdc.bootable;
    }

    return f;
}